

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,
          lexeme_t<cfgfile::string_trait_t> *lexeme,tag_t<cfgfile::string_trait_t> *tag)

{
  lexeme_type_t lVar1;
  __type _Var2;
  exception_t<cfgfile::string_trait_t> *peVar3;
  allocator local_1db;
  allocator local_1da;
  allocator local_1d9;
  string local_1d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = lexeme->m_type;
  if (lVar1 == null) {
    peVar3 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_138,"Unexpected end of file. In file \"",&local_1d9);
    std::__cxx11::string::string((string *)&local_118,local_138);
    std::operator+(&local_f8,&local_118,&((this->m_lex).m_stream)->m_file_name);
    std::__cxx11::string::string(local_178,"\" on line ",&local_1da);
    std::__cxx11::string::string((string *)&local_158,local_178);
    std::operator+(&local_d8,&local_f8,&local_158);
    std::__cxx11::to_string(&local_198,(this->m_lex).m_line_number);
    std::operator+(&local_b8,&local_d8,&local_198);
    std::__cxx11::string::string(local_1d8,".",&local_1db);
    std::__cxx11::string::string((string *)&local_1b8,local_1d8);
    std::operator+(&local_78,&local_b8,&local_1b8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar3,&local_78);
    __cxa_throw(peVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  if (lVar1 != finish) {
    if (lVar1 != start) {
      _Var2 = std::operator==(&tag->m_name,&lexeme->m_value);
      if (_Var2) {
        local_b8._M_dataplus._M_p = (pointer)tag;
        std::
        deque<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
        ::emplace_back<cfgfile::tag_t<cfgfile::string_trait_t>*>
                  ((deque<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
                    *)&(this->super_parser_base_t<cfgfile::string_trait_t>).m_stack,
                   (tag_t<cfgfile::string_trait_t> **)&local_b8);
        local_88 = (this->m_lex).m_line_number;
        uStack_80 = (this->m_lex).m_column_number;
        std::__cxx11::string::string
                  ((string *)&local_b8,(string *)&((this->m_lex).m_stream)->m_file_name);
        local_98 = (undefined4)local_88;
        uStack_94 = local_88._4_4_;
        uStack_90 = (undefined4)uStack_80;
        uStack_8c = uStack_80._4_4_;
        (*tag->_vptr_tag_t[4])(tag,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      return _Var2;
    }
    peVar3 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              (local_138,
               "Unexpected start curl brace. We expected tag name, but we\'ve got start curl brace. In file \""
               ,&local_1d9);
    std::__cxx11::string::string((string *)&local_118,local_138);
    std::operator+(&local_f8,&local_118,&((this->m_lex).m_stream)->m_file_name);
    std::__cxx11::string::string(local_178,"\" on line ",&local_1da);
    std::__cxx11::string::string((string *)&local_158,local_178);
    std::operator+(&local_d8,&local_f8,&local_158);
    std::__cxx11::to_string(&local_198,(this->m_lex).m_line_number);
    std::operator+(&local_b8,&local_d8,&local_198);
    std::__cxx11::string::string(local_1d8,".",&local_1db);
    std::__cxx11::string::string((string *)&local_1b8,local_1d8);
    std::operator+(&local_38,&local_b8,&local_1b8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar3,&local_38);
    __cxa_throw(peVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  peVar3 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_138,
             "Unexpected finish curl brace. We expected tag name, but we\'ve got finish curl brace. In file \""
             ,&local_1d9);
  std::__cxx11::string::string((string *)&local_118,local_138);
  std::operator+(&local_f8,&local_118,&((this->m_lex).m_stream)->m_file_name);
  std::__cxx11::string::string(local_178,"\" on line ",&local_1da);
  std::__cxx11::string::string((string *)&local_158,local_178);
  std::operator+(&local_d8,&local_f8,&local_158);
  std::__cxx11::to_string(&local_198,(this->m_lex).m_line_number);
  std::operator+(&local_b8,&local_d8,&local_198);
  std::__cxx11::string::string(local_1d8,".",&local_1db);
  std::__cxx11::string::string((string *)&local_1b8,local_1d8);
  std::operator+(&local_58,&local_b8,&local_1b8);
  exception_t<cfgfile::string_trait_t>::exception_t(peVar3,&local_58);
  __cxa_throw(peVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

bool start_tag_parsing( const lexeme_t< Trait > & lexeme,
		tag_t< Trait > & tag )
	{
		if( lexeme.type() == lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected start curl brace. "
					"We expected tag name, but we've got start curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::finish )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected finish curl brace. "
					"We expected tag name, but we've got finish curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( tag.name() == lexeme.value() )
		{
			this->m_stack.push( &tag );

			tag.on_start( parser_info_t< Trait >(
				m_lex.input_stream().file_name(),
				m_lex.line_number(),
				m_lex.column_number() ) );

			return true;
		}

		return false;
	}